

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

void my_numbox_label_font(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  t_float tVar5;
  
  tVar5 = atom_getfloatarg(1,ac,av);
  iVar3 = 4;
  if (4 < (int)tVar5) {
    iVar3 = (int)tVar5;
  }
  (x->x_gui).x_fontsize = iVar3;
  tVar5 = atom_getfloatarg(0,ac,av);
  uVar4 = (int)tVar5 & 0x3f;
  if (2 < (uint)(int)tVar5) {
    uVar4 = 0;
  }
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x->x_gui).x_fsf & 0xffffffc0 | uVar4);
  iVar3 = 0x1f;
  if (uVar4 == 2) {
    iVar3 = 0x19;
  }
  iVar2 = 0x1b;
  if (uVar4 != 1) {
    iVar2 = iVar3;
  }
  iVar3 = (x->x_gui).x_h;
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w =
       ((int)(CONCAT44(iVar3 - (iVar3 >> 0x1f) >> 0x1f,iVar3 / 2) / (long)iVar1) +
        (x->x_numwidth * (x->x_gui).x_fontsize * iVar2) / 0x24 + 4) * iVar1;
  iemgui_label_font(x,&x->x_gui,s,ac,av);
  return;
}

Assistant:

static void my_numbox_label_font(t_my_numbox *x,
    t_symbol *s, int ac, t_atom *av)
{
    int f = (int)atom_getfloatarg(1, ac, av);

    if(f < 4)
        f = 4;
    x->x_gui.x_fontsize = f;
    f = (int)atom_getfloatarg(0, ac, av);
    if((f < 0) || (f > 2))
        f = 0;
    x->x_gui.x_fsf.x_font_style = f;
    my_numbox_calc_fontwidth(x);
    iemgui_label_font((void *)x, &x->x_gui, s, ac, av);
}